

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pDiv->HNum;
  if (((int)uVar1 < 1) || (p->nItemsAlloc < (int)uVar1)) {
    __assert_fail("(pDiv)->HNum >= 1 && (pDiv)->HNum <= p->nItemsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                  ,0xe3,"void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *, Fxu_Double *)");
  }
  if ((uVar1 != 1) && (p->pTree[uVar1 >> 1]->Weight < pDiv->Weight)) {
    Fxu_HeapDoubleMoveUp(p,(Fxu_Double *)(ulong)uVar1);
    return;
  }
  uVar2 = uVar1 * 2;
  if (((p->nItems < (int)uVar2) || (p->pTree[(int)uVar2]->Weight <= pDiv->Weight)) &&
     ((p->nItems <= (int)uVar2 || (p->pTree[(int)(uVar2 | 1)]->Weight <= pDiv->Weight)))) {
    return;
  }
  Fxu_HeapDoubleMoveDn(p,(Fxu_Double *)(ulong)uVar1);
  return;
}

Assistant:

void Fxu_HeapDoubleUpdate( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
//printf( "Updating divisor %d.\n", pDiv->Num );

    FXU_HEAP_DOUBLE_ASSERT(p,pDiv);
    if ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,pDiv) && 
         FXU_HEAP_DOUBLE_WEIGHT(pDiv) > FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_PARENT(p,pDiv) ) )
        Fxu_HeapDoubleMoveUp( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD1(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD2(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
}